

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NanoVM.cpp
# Opt level: O0

bool __thiscall NanoVM::fetch(NanoVM *this,Instruction *inst)

{
  ulong uVar1;
  byte bVar2;
  ostream *this_00;
  ulong *puVar3;
  uint64_t value;
  uchar *rawIp;
  Instruction *inst_local;
  NanoVM *this_local;
  
  if ((this->cpu).registers[8] < (this->cpu).codeSize) {
    puVar3 = (ulong *)((this->cpu).codeBase + (this->cpu).registers[8]);
    uVar1 = *puVar3;
    inst->opcode = (byte)uVar1 & 0x1f;
    inst->dstReg = (uchar)((uVar1 & 0xe0) >> 5);
    bVar2 = (byte)(uVar1 >> 8);
    inst->srcType = bVar2 & 0x80;
    inst->srcReg = bVar2 & 7;
    inst->srcSize = (uchar)((uVar1 >> 8 & 0x60) >> 5);
    inst->isDstMem = (uVar1 >> 8 & 0x10) != 0;
    inst->isSrcMem = (uVar1 >> 8 & 8) != 0;
    if (inst->srcType == '\0') {
      inst->instructionSize = '\x02';
    }
    else {
      switch(inst->srcSize) {
      case '\0':
        inst->immediate = uVar1 >> 0x10 & 0xff;
        inst->instructionSize = '\x03';
        break;
      case '\x01':
        inst->immediate = uVar1 >> 0x10 & 0xffff;
        inst->instructionSize = '\x04';
        break;
      case '\x02':
        inst->immediate = uVar1 >> 0x10 & 0xffffffff;
        inst->instructionSize = '\x06';
        break;
      case '\x03':
        inst->immediate = *(uint64_t *)((long)puVar3 + 2);
        inst->instructionSize = '\n';
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cout,"IP out of bounds");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool NanoVM::fetch(Instruction &inst) const {
	// Read 64bit to try and minimize the required memory reading
	// This increases the performance

	// Sanity check the ip that it is within code page
	if (cpu.registers[ip] >= cpu.codeSize) {
		std::cout << "IP out of bounds" << std::endl;
		return false;
	}
	// Parse the instruction
	unsigned char* rawIp = cpu.codeBase + cpu.registers[ip];
	uint64_t value = *reinterpret_cast<uint64_t*>(rawIp);
	inst.opcode   =  (value & (unsigned char)OPCODE_MASK);
	inst.dstReg   =  ((value & DST_REG_MASK) >> 5);
	inst.srcType  =  (value >> 8) & SRC_TYPE_MASK;
	inst.srcReg   =   (value >> 8) & SRC_REG_MASK;
	inst.srcSize  =  ((value >> 8) & SRC_SIZE_MASK) >> 5;
	inst.isDstMem =  ((value >> 8) & DST_MEM_MASK);
	inst.isSrcMem =  ((value >> 8) & SRC_MEM_MASK);
	// If source is immediate value, read it to the instruction struct
	if (inst.srcType) {
		// If the immediate value fit in the initial value. Parse it with bitshift. It is faster than reading memory again
		switch (inst.srcSize) {
		case Byte:
			inst.immediate = (uint8_t)(value >> 16);
			inst.instructionSize = 3;
			break;
		case Short:
			inst.immediate = (uint16_t)(value >> 16);
			inst.instructionSize = 4;
			break;
		case Dword:
			inst.immediate = (uint32_t)(value >> 16);
			inst.instructionSize = 6;
			break;
		case Qword:
			// In the case of qword we have to perform another read operations
			inst.immediate = *(uint64_t*)(rawIp + 2);
			inst.instructionSize = 10;
			break;
		}
	}
	else {
		inst.instructionSize = 2;
	}
	return true;

}